

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O1

cio_error write_some_all(cio_io_stream *io_stream,cio_write_buffer *buf,
                        cio_io_stream_write_handler_t handler,void *handler_context)

{
  size_t __n;
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  cio_write_buffer *pcVar5;
  
  sVar3 = write_check_buffer_pos;
  if ((buf->data).head.q_len == 0) {
    sVar4 = 0;
  }
  else {
    uVar2 = 0;
    sVar4 = 0;
    pcVar5 = buf;
    do {
      pcVar5 = pcVar5->next;
      __n = (pcVar5->data).element.length;
      if (__n != 0) {
        memcpy(write_check_buffer + sVar3,(pcVar5->data).element.field_0.const_data,__n);
      }
      sVar1 = (pcVar5->data).element.length;
      sVar3 = sVar3 + sVar1;
      sVar4 = sVar4 + sVar1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < (buf->data).head.q_len);
  }
  write_check_buffer_pos = sVar3;
  (*handler)(io_stream,handler_context,buf,CIO_SUCCESS,sVar4);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error write_some_all(struct cio_io_stream *io_stream, struct cio_write_buffer *buf, cio_io_stream_write_handler_t handler, void *handler_context)
{
	struct cio_write_buffer *wb = buf->next;
	size_t total_length = 0;

	for (size_t i = 0; i < cio_write_buffer_get_num_buffer_elements(buf); i++) {
		if (wb->data.element.length > 0) {
			memcpy(&write_check_buffer[write_check_buffer_pos], wb->data.element.const_data, wb->data.element.length);
		}

		write_check_buffer_pos += wb->data.element.length;
		total_length += wb->data.element.length;
		wb = wb->next;
	}

	handler(io_stream, handler_context, buf, CIO_SUCCESS, total_length);

	return CIO_SUCCESS;
}